

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O2

void __thiscall QGraphicsGridLayout::~QGraphicsGridLayout(QGraphicsGridLayout *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  QGraphicsLayoutItem *this_00;
  
  (this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem =
       (_func_int **)&PTR__QGraphicsGridLayout_007eb270;
  uVar2 = count(this);
  while (0 < (int)uVar2) {
    uVar2 = uVar2 - 1;
    iVar3 = (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[10])
                      (this,(ulong)uVar2);
    this_00 = (QGraphicsLayoutItem *)CONCAT44(extraout_var,iVar3);
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[0xb])(this);
    if (this_00 != (QGraphicsLayoutItem *)0x0) {
      QGraphicsLayoutItem::setParentLayoutItem(this_00,(QGraphicsLayoutItem *)0x0);
      bVar1 = QGraphicsLayoutItem::ownedByLayout(this_00);
      if (bVar1) {
        (*this_00->_vptr_QGraphicsLayoutItem[1])(this_00);
      }
    }
  }
  QGraphicsLayout::~QGraphicsLayout(&this->super_QGraphicsLayout);
  return;
}

Assistant:

QGraphicsGridLayout::~QGraphicsGridLayout()
{
    for (int i = count() - 1; i >= 0; --i) {
        QGraphicsLayoutItem *item = itemAt(i);
        // The following lines can be removed, but this removes the item
        // from the layout more efficiently than the implementation of
        // ~QGraphicsLayoutItem.
        removeAt(i);
        if (item) {
            item->setParentLayoutItem(nullptr);
            if (item->ownedByLayout())
                delete item;
        }
    }
}